

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::CopyPchCompilePdb
          (cmLocalGenerator *this,string *config,string *language,cmGeneratorTarget *target,
          string *ReuseFrom,cmGeneratorTarget *reuseTarget,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *extensions)

{
  cmTarget *this_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string_view sVar1;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist;
  undefined8 this_01;
  bool bVar2;
  uint uVar3;
  cmGlobalGenerator *pcVar4;
  cmLocalGenerator *pcVar5;
  string *psVar6;
  string *psVar7;
  ostream *poVar8;
  reference args_3;
  ulong uVar9;
  pointer pcVar10;
  cmSourceFile *this_02;
  string *local_8f8;
  allocator<char> local_729;
  string local_728;
  allocator<char> local_701;
  string local_700;
  allocator<char> local_6d9;
  string local_6d8;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_6b8;
  cmSourceFile *local_6b0;
  cmSourceFile *copy_rule;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_690;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_688;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_66a;
  undefined1 local_669;
  string local_668;
  string *local_648;
  string local_640;
  iterator local_620;
  size_type local_618;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_610;
  cmCustomCommandLines local_5f8;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_5e0;
  __single_object cc;
  string local_5a8;
  undefined1 local_588 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  outputs;
  char *no_message;
  string local_558;
  string_view local_538;
  string local_528;
  string local_508;
  string_view local_4e8;
  string local_4d8;
  string_view local_4b8;
  string local_4a8;
  basic_string_view<char,_std::char_traits<char>_> local_488;
  undefined1 local_478 [16];
  undefined1 local_468 [16];
  undefined1 local_458 [16];
  iterator local_448;
  undefined8 local_440;
  undefined1 local_438 [8];
  cmCustomCommandLines commandLines;
  anon_class_16_2_381a533d configGenex;
  allocator<char> local_3e9;
  string local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3c8;
  string *prefix;
  string dest_file;
  string to_file;
  string to_dir;
  string from_file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extension;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  cmGeneratedFileStream file;
  undefined1 local_b0 [8];
  string copy_script;
  string target_compile_pdb_dir;
  allocator<char> local_59;
  undefined1 local_58 [8];
  string pdb_prefix;
  cmGeneratorTarget *reuseTarget_local;
  string *ReuseFrom_local;
  cmGeneratorTarget *target_local;
  string *language_local;
  string *config_local;
  cmLocalGenerator *this_local;
  
  pdb_prefix.field_2._8_8_ = reuseTarget;
  pcVar4 = GetGlobalGenerator(this);
  uVar3 = (*pcVar4->_vptr_cmGlobalGenerator[0x28])();
  if ((uVar3 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_58,"",&local_59);
    std::allocator<char>::~allocator(&local_59);
  }
  else {
    cmStrCat<std::__cxx11::string_const&,char_const(&)[2]>
              ((string *)local_58,config,(char (*) [2])0x1100c21);
  }
  pcVar5 = cmGeneratorTarget::GetLocalGenerator(target);
  psVar6 = GetCurrentBinaryDirectory_abi_cxx11_(pcVar5);
  psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(target);
  cmStrCat<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string_const&,char_const(&)[6]>
            ((string *)((long)&copy_script.field_2 + 8),psVar6,(char (*) [2])0x1100c21,psVar7,
             (char (*) [6])0x108cb7d);
  file._608_8_ = std::__cxx11::string::c_str();
  cmStrCat<std::__cxx11::string_const&,char_const(&)[14],char_const*,char_const(&)[7]>
            ((string *)local_b0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&copy_script.field_2 + 8),(char (*) [14])"copy_idb_pdb_",
             (char **)&file.field_0x260,(char (*) [7])0x1056dfe);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)&__range1,(string *)local_b0,false,None);
  std::operator<<((ostream *)&__range1,"# CMake generated file\n");
  poVar8 = std::operator<<((ostream *)&__range1,
                           "# The compiler generated pdb file needs to be written to disk\n");
  poVar8 = std::operator<<(poVar8,"# by mspdbsrv. The foreach retry loop is needed to make sure\n");
  std::operator<<(poVar8,"# the pdb file is ready to be copied.\n\n");
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(extensions);
  extension = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end(extensions);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&extension), bVar2) {
    args_3 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
    pcVar5 = cmGeneratorTarget::GetLocalGenerator((cmGeneratorTarget *)pdb_prefix.field_2._8_8_);
    psVar6 = GetCurrentBinaryDirectory_abi_cxx11_(pcVar5);
    cmStrCat<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string_const&,char_const(&)[19],std::__cxx11::string_const&,std::__cxx11::string_const&>
              ((string *)((long)&to_dir.field_2 + 8),psVar6,(char (*) [2])0x1100c21,ReuseFrom,
               (char (*) [19])".dir/${PDB_PREFIX}",ReuseFrom,args_3);
    pcVar5 = cmGeneratorTarget::GetLocalGenerator(target);
    psVar6 = GetCurrentBinaryDirectory_abi_cxx11_(pcVar5);
    psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(target);
    cmStrCat<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string_const&,char_const(&)[19]>
              ((string *)((long)&to_file.field_2 + 8),psVar6,(char (*) [2])0x1100c21,psVar7,
               (char (*) [19])".dir/${PDB_PREFIX}");
    cmStrCat<std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&>
              ((string *)((long)&dest_file.field_2 + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&to_file.field_2 + 8),ReuseFrom,args_3);
    std::__cxx11::string::string((string *)&prefix,(string *)(dest_file.field_2._M_local_buf + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e8,"PREFIX",&local_3e9);
    psVar6 = cmGeneratorTarget::GetSafeProperty(target,&local_3e8);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::allocator<char>::~allocator(&local_3e9);
    local_3c8 = psVar6;
    uVar9 = std::__cxx11::string::empty();
    if ((uVar9 & 1) == 0) {
      cmStrCat<std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&>
                ((string *)&configGenex.config,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&to_file.field_2 + 8),local_3c8,ReuseFrom,args_3);
      std::__cxx11::string::operator=((string *)&prefix,(string *)&configGenex.config);
      std::__cxx11::string::~string((string *)&configGenex.config);
    }
    std::operator<<((ostream *)&__range1,"foreach(retry RANGE 1 30)\n");
    poVar8 = std::operator<<((ostream *)&__range1,"  if (EXISTS \"");
    poVar8 = std::operator<<(poVar8,(string *)(to_dir.field_2._M_local_buf + 8));
    poVar8 = std::operator<<(poVar8,"\" AND (NOT EXISTS \"");
    poVar8 = std::operator<<(poVar8,(string *)&prefix);
    poVar8 = std::operator<<(poVar8,"\" OR NOT \"");
    poVar8 = std::operator<<(poVar8,(string *)&prefix);
    poVar8 = std::operator<<(poVar8,"  \" IS_NEWER_THAN \"");
    poVar8 = std::operator<<(poVar8,(string *)(to_dir.field_2._M_local_buf + 8));
    std::operator<<(poVar8,"\"))\n");
    std::operator<<((ostream *)&__range1,"    execute_process(COMMAND ${CMAKE_COMMAND} -E copy");
    poVar8 = std::operator<<((ostream *)&__range1," \"");
    poVar8 = std::operator<<(poVar8,(string *)(to_dir.field_2._M_local_buf + 8));
    poVar8 = std::operator<<(poVar8,"\"");
    poVar8 = std::operator<<(poVar8," \"");
    poVar8 = std::operator<<(poVar8,(string *)(to_file.field_2._M_local_buf + 8));
    poVar8 = std::operator<<(poVar8,"\" RESULT_VARIABLE result ");
    std::operator<<(poVar8," ERROR_QUIET)\n");
    poVar8 = std::operator<<((ostream *)&__range1,"    if (NOT result EQUAL 0)\n");
    poVar8 = std::operator<<(poVar8,"      execute_process(COMMAND ${CMAKE_COMMAND}");
    poVar8 = std::operator<<(poVar8," -E sleep 1)\n");
    std::operator<<(poVar8,"    else()\n");
    uVar9 = std::__cxx11::string::empty();
    if ((uVar9 & 1) == 0) {
      poVar8 = std::operator<<((ostream *)&__range1,"  file(REMOVE \"");
      poVar8 = std::operator<<(poVar8,(string *)&prefix);
      std::operator<<(poVar8,"\")\n");
      poVar8 = std::operator<<((ostream *)&__range1,"  file(RENAME \"");
      poVar8 = std::operator<<(poVar8,(string *)(dest_file.field_2._M_local_buf + 8));
      poVar8 = std::operator<<(poVar8,"\" \"");
      poVar8 = std::operator<<(poVar8,(string *)&prefix);
      std::operator<<(poVar8,"\")\n");
    }
    poVar8 = std::operator<<((ostream *)&__range1,"      break()\n");
    std::operator<<(poVar8,"    endif()\n");
    poVar8 = std::operator<<((ostream *)&__range1,"  elseif(NOT EXISTS \"");
    poVar8 = std::operator<<(poVar8,(string *)(to_dir.field_2._M_local_buf + 8));
    poVar8 = std::operator<<(poVar8,"\")\n");
    poVar8 = std::operator<<(poVar8,"    execute_process(COMMAND ${CMAKE_COMMAND}");
    poVar8 = std::operator<<(poVar8," -E sleep 1)\n");
    std::operator<<(poVar8,"  endif()\n");
    std::operator<<((ostream *)&__range1,"endforeach()\n");
    std::__cxx11::string::~string((string *)&prefix);
    std::__cxx11::string::~string((string *)(dest_file.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(to_file.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(to_dir.field_2._M_local_buf + 8));
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  configGenex.this = (cmLocalGenerator *)config;
  psVar6 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
  local_4b8 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar6);
  CopyPchCompilePdb(std::__cxx11::string_const&,std::__cxx11::string_const&,cmGeneratorTarget*,std::__cxx11::string_const&,cmGeneratorTarget*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
  ::$_0::operator()::char_traits<char>_>__const
            (&local_4a8,
             &commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
              super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,local_4b8);
  local_488 = (basic_string_view<char,_std::char_traits<char>_>)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_4a8);
  cmStrCat<char_const(&)[14],std::__cxx11::string_const&>
            (&local_508,(char (*) [14])"-DPDB_PREFIX=",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
  local_4e8 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_508);
  CopyPchCompilePdb(std::__cxx11::string_const&,std::__cxx11::string_const&,cmGeneratorTarget*,std::__cxx11::string_const&,cmGeneratorTarget*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
  ::$_0::operator()::char_traits<char>_>__const
            (&local_4d8,
             &commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
              super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,local_4e8);
  local_478 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_4d8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_538,"-P");
  CopyPchCompilePdb(std::__cxx11::string_const&,std::__cxx11::string_const&,cmGeneratorTarget*,std::__cxx11::string_const&,cmGeneratorTarget*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
  ::$_0::operator()::char_traits<char>_>__const
            (&local_528,
             &commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
              super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,local_538);
  local_468 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_528);
  sVar1 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_b0);
  CopyPchCompilePdb(std::__cxx11::string_const&,std::__cxx11::string_const&,cmGeneratorTarget*,std::__cxx11::string_const&,cmGeneratorTarget*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
  ::$_0::operator()::char_traits<char>_>__const
            (&local_558,
             &commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
              super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,sVar1);
  local_458 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_558);
  local_448 = &local_488;
  local_440 = 4;
  ilist._M_len = 4;
  ilist._M_array = local_448;
  cmMakeSingleCommandLine((cmCustomCommandLines *)local_438,ilist);
  std::__cxx11::string::~string((string *)&local_558);
  std::__cxx11::string::~string((string *)&local_528);
  std::__cxx11::string::~string((string *)&local_4d8);
  std::__cxx11::string::~string((string *)&local_508);
  std::__cxx11::string::~string((string *)&local_4a8);
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x10b83c7;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_588);
  cmStrCat<std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,char_const(&)[5]>
            ((string *)&cc,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&copy_script.field_2 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,ReuseFrom
             ,(char (*) [5])".pdb");
  sVar1 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)&cc);
  CopyPchCompilePdb(std::__cxx11::string_const&,std::__cxx11::string_const&,cmGeneratorTarget*,std::__cxx11::string_const&,cmGeneratorTarget*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
  ::$_0::operator()::char_traits<char>_>__const
            (&local_5a8,
             &commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
              super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,sVar1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_588,&local_5a8);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::__cxx11::string::~string((string *)&cc);
  std::make_unique<cmCustomCommand>();
  pcVar10 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                      (&local_5e0);
  cmCustomCommandLines::cmCustomCommandLines(&local_5f8,(cmCustomCommandLines *)local_438);
  cmCustomCommand::SetCommandLines(pcVar10,&local_5f8);
  cmCustomCommandLines::~cmCustomCommandLines(&local_5f8);
  pcVar10 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                      (&local_5e0);
  cmCustomCommand::SetComment
            (pcVar10,(char *)outputs.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pcVar10 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                      (&local_5e0);
  cmCustomCommand::SetStdPipesUTF8(pcVar10,true);
  pcVar10 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                      (&local_5e0);
  this_01 = pdb_prefix.field_2._8_8_;
  local_669 = 1;
  local_648 = &local_640;
  std::__cxx11::string::string((string *)&local_668);
  cmGeneratorTarget::GetPchFile(&local_640,(cmGeneratorTarget *)this_01,config,language,&local_668);
  local_669 = 0;
  local_620 = &local_640;
  local_618 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_66a);
  __l._M_len = local_618;
  __l._M_array = local_620;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_610,__l,&local_66a);
  cmCustomCommand::AppendDepends(pcVar10,&local_610);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_610);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_66a);
  local_8f8 = (string *)&local_620;
  do {
    local_8f8 = local_8f8 + -1;
    std::__cxx11::string::~string((string *)local_8f8);
  } while (local_8f8 != &local_640);
  std::__cxx11::string::~string((string *)&local_668);
  pcVar4 = GetGlobalGenerator(this);
  uVar3 = (*pcVar4->_vptr_cmGlobalGenerator[0x2a])();
  if ((uVar3 & 1) == 0) {
    pcVar10 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                        (&local_5e0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&copy_rule,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_588);
    cmCustomCommand::SetOutputs
              (pcVar10,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&copy_rule);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&copy_rule);
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::unique_ptr
              (&local_6b8,&local_5e0);
    this_02 = AddCustomCommandToOutput(this,&local_6b8,false);
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr(&local_6b8)
    ;
    local_6b0 = this_02;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6d8,"CXX_SCAN_FOR_MODULES",&local_6d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_700,"0",&local_701);
    cmSourceFile::SetProperty(this_02,&local_6d8,&local_700);
    std::__cxx11::string::~string((string *)&local_700);
    std::allocator<char>::~allocator(&local_701);
    std::__cxx11::string::~string((string *)&local_6d8);
    std::allocator<char>::~allocator(&local_6d9);
    if (local_6b0 != (cmSourceFile *)0x0) {
      psVar6 = cmSourceFile::ResolveFullPath(local_6b0,(string *)0x0,(string *)0x0);
      cmGeneratorTarget::AddSource(target,psVar6,false);
    }
  }
  else {
    pcVar10 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                        (&local_5e0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_688,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_588);
    cmCustomCommand::SetByproducts(pcVar10,&local_688);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_688);
    psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(target);
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::unique_ptr
              (&local_690,&local_5e0);
    AddCustomCommandToTarget(this,psVar6,PRE_BUILD,&local_690,Accept);
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr(&local_690)
    ;
  }
  this_00 = target->Target;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_728,"COMPILE_PDB_OUTPUT_DIRECTORY",&local_729);
  cmTarget::SetProperty(this_00,&local_728,(string *)((long)&copy_script.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_728);
  std::allocator<char>::~allocator(&local_729);
  std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr(&local_5e0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_588);
  cmCustomCommandLines::~cmCustomCommandLines((cmCustomCommandLines *)local_438);
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&__range1);
  std::__cxx11::string::~string((string *)local_b0);
  std::__cxx11::string::~string((string *)(copy_script.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_58);
  return;
}

Assistant:

void cmLocalGenerator::CopyPchCompilePdb(
  const std::string& config, const std::string& language,
  cmGeneratorTarget* target, const std::string& ReuseFrom,
  cmGeneratorTarget* reuseTarget, const std::vector<std::string>& extensions)
{
  const std::string pdb_prefix =
    this->GetGlobalGenerator()->IsMultiConfig() ? cmStrCat(config, "/") : "";

  const std::string target_compile_pdb_dir =
    cmStrCat(target->GetLocalGenerator()->GetCurrentBinaryDirectory(), "/",
             target->GetName(), ".dir/");

  const std::string copy_script = cmStrCat(
    target_compile_pdb_dir, "copy_idb_pdb_", config.c_str(), ".cmake");
  cmGeneratedFileStream file(copy_script);

  file << "# CMake generated file\n";

  file << "# The compiler generated pdb file needs to be written to disk\n"
       << "# by mspdbsrv. The foreach retry loop is needed to make sure\n"
       << "# the pdb file is ready to be copied.\n\n";

  for (auto const& extension : extensions) {
    const std::string from_file =
      cmStrCat(reuseTarget->GetLocalGenerator()->GetCurrentBinaryDirectory(),
               "/", ReuseFrom, ".dir/${PDB_PREFIX}", ReuseFrom, extension);

    const std::string to_dir =
      cmStrCat(target->GetLocalGenerator()->GetCurrentBinaryDirectory(), "/",
               target->GetName(), ".dir/${PDB_PREFIX}");

    const std::string to_file = cmStrCat(to_dir, ReuseFrom, extension);

    std::string dest_file = to_file;

    std::string const& prefix = target->GetSafeProperty("PREFIX");
    if (!prefix.empty()) {
      dest_file = cmStrCat(to_dir, prefix, ReuseFrom, extension);
    }

    file << "foreach(retry RANGE 1 30)\n";
    file << "  if (EXISTS \"" << from_file << "\" AND (NOT EXISTS \""
         << dest_file << "\" OR NOT \"" << dest_file << "  \" IS_NEWER_THAN \""
         << from_file << "\"))\n";
    file << "    execute_process(COMMAND ${CMAKE_COMMAND} -E copy";
    file << " \"" << from_file << "\""
         << " \"" << to_dir << "\" RESULT_VARIABLE result "
         << " ERROR_QUIET)\n";
    file << "    if (NOT result EQUAL 0)\n"
         << "      execute_process(COMMAND ${CMAKE_COMMAND}"
         << " -E sleep 1)\n"
         << "    else()\n";
    if (!prefix.empty()) {
      file << "  file(REMOVE \"" << dest_file << "\")\n";
      file << "  file(RENAME \"" << to_file << "\" \"" << dest_file << "\")\n";
    }
    file << "      break()\n"
         << "    endif()\n";
    file << "  elseif(NOT EXISTS \"" << from_file << "\")\n"
         << "    execute_process(COMMAND ${CMAKE_COMMAND}"
         << " -E sleep 1)\n"
         << "  endif()\n";
    file << "endforeach()\n";
  }

  auto configGenex = [&](cm::string_view expr) -> std::string {
    if (this->GetGlobalGenerator()->IsMultiConfig()) {
      return cmStrCat("$<$<CONFIG:", config, ">:", expr, ">");
    }
    return std::string(expr);
  };

  cmCustomCommandLines commandLines = cmMakeSingleCommandLine(
    { configGenex(cmSystemTools::GetCMakeCommand()),
      configGenex(cmStrCat("-DPDB_PREFIX=", pdb_prefix)), configGenex("-P"),
      configGenex(copy_script) });

  const char* no_message = "";

  std::vector<std::string> outputs;
  outputs.push_back(configGenex(
    cmStrCat(target_compile_pdb_dir, pdb_prefix, ReuseFrom, ".pdb")));

  auto cc = cm::make_unique<cmCustomCommand>();
  cc->SetCommandLines(commandLines);
  cc->SetComment(no_message);
  cc->SetStdPipesUTF8(true);
  cc->AppendDepends({ reuseTarget->GetPchFile(config, language) });

  if (this->GetGlobalGenerator()->IsVisualStudio()) {
    cc->SetByproducts(outputs);
    this->AddCustomCommandToTarget(
      target->GetName(), cmCustomCommandType::PRE_BUILD, std::move(cc),
      cmObjectLibraryCommands::Accept);
  } else {
    cc->SetOutputs(outputs);
    cmSourceFile* copy_rule = this->AddCustomCommandToOutput(std::move(cc));
    copy_rule->SetProperty("CXX_SCAN_FOR_MODULES", "0");

    if (copy_rule) {
      target->AddSource(copy_rule->ResolveFullPath());
    }
  }

  target->Target->SetProperty("COMPILE_PDB_OUTPUT_DIRECTORY",
                              target_compile_pdb_dir);
}